

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::iterate
          (ProgramInterfaceQueryTestCase *this)

{
  RenderContext **ppRVar1;
  pointer *ppuVar2;
  RenderContext *renderCtx;
  TestLog *pTVar3;
  pointer pbVar4;
  Context *pCVar5;
  bool bVar6;
  ShaderType type;
  int iVar7;
  Program *program_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  VariableSearchFilter VVar9;
  long *plVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TestError *this_00;
  pointer ppPVar11;
  _func_int **pp_Var12;
  TestLog *pTVar13;
  char *pcVar14;
  int ndx;
  ProgramInterface PVar15;
  pointer *pppPVar16;
  RenderContext **ppRVar17;
  long lVar18;
  long lVar19;
  ostringstream *poVar20;
  ContextInfo **__x;
  VariableSearchFilter variableFilter_1;
  long local_6c0;
  VariableSearchFilter variableFilter;
  iterator iStack_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetResources;
  ScopedLogSection section_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  BlockReferencedByShaderValidator referencedByGeometryVerifier;
  BlockReferencedByShaderValidator referencedByComputeVerifier;
  BlockNameLengthValidator nameLengthValidator;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators;
  BlockReferencedByShaderValidator referencedByTessControlVerifier;
  BlockReferencedByShaderValidator referencedByFragmentVerifier;
  ScopedLogSection section_1;
  iterator iStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  char *local_458;
  undefined4 local_450;
  VariableSearchFilter local_44c;
  undefined4 local_444;
  ScopedLogSection section_4;
  BlockReferencedByShaderValidator referencedByTessEvaluationVerifier;
  VariableSearchFilter blockFilter;
  long local_3f8;
  RenderContext *local_3f0;
  ContextInfo *local_3e8;
  char *local_3e0;
  undefined4 local_3d8;
  VariableSearchFilter local_3d4;
  undefined4 local_3cc;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_1;
  BufferBindingValidator bufferBindingValidator;
  PerPatchValidator perPatchValidator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  MessageBuilder builder;
  TopLevelArraySizeValidator topLevelArraySizeValidator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ShaderProgram program;
  
  program_00 = getAndCheckProgramDefinition(this);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&targetResources,this);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources((ProgramSources *)&builder,program_00);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&builder);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&builder.field_0xb0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &builder.field_0x90);
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&builder.m_log + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  builder.m_log = (TestLog *)&builder.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"Program","");
  ppRVar1 = &nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext;
  nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
       (_func_int **)ppRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nameLengthValidator,"Program","");
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar3,(string *)&builder,(string *)&nameLengthValidator);
  if ((RenderContext **)
      nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator !=
      ppRVar1) {
    operator_delete(nameLengthValidator.super_SingleBlockValidator.super_PropValidator.
                    _vptr_PropValidator,
                    (ulong)((long)&(nameLengthValidator.super_SingleBlockValidator.
                                    super_PropValidator.m_renderContext)->_vptr_RenderContext + 1));
  }
  if (builder.m_log != (TestLog *)&builder.field_0x10) {
    operator_delete(builder.m_log,builder._16_8_ + 1);
  }
  pvVar8 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(program_00);
  if ((pvVar8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    builder.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar20 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar20,"Transform feedback varyings: {",0x1e);
    lVar19 = 0;
    for (lVar18 = 0;
        pvVar8 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                           (program_00),
        lVar18 < (int)((ulong)((long)(pvVar8->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar8->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar18 = lVar18 + 1) {
      if (lVar19 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,"\"",1);
      pvVar8 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                         (program_00);
      pbVar4 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar20,*(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar19),
                 *(long *)((long)&pbVar4->_M_string_length + lVar19));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,"\"",1);
      lVar19 = lVar19 + 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,"}",1);
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar20);
    std::ios_base::~ios_base((ios_base *)&builder.field_0x78);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    builder.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar20 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar20,
               "Program build failed, checking if program exceeded implementation limits",0x48);
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar20);
    std::ios_base::~ios_base((ios_base *)&builder.field_0x78);
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    checkProgramResourceUsage
              (program_00,(Functions *)CONCAT44(extraout_var_04,iVar7),
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    builder.m_log = (TestLog *)&builder.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"could not build program","")
    ;
    tcu::TestError::TestError(this_00,(string *)&builder);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestLog::endSection(section.m_log);
  PVar15 = (this->m_queryTarget).interface;
  switch(PVar15) {
  case PROGRAMINTERFACE_UNIFORM:
    variableFilter_1 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_UNIFORM);
    pCVar5 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53500;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx = pCVar5->m_testCtx
    ;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_SIZE;
    nameLengthValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53650;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_STRIDE;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter_1.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53730;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BLOCK_INDEX;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53778;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR;
    referencedByGeometryVerifier.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b537c0;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_STRIDE;
    referencedByTessControlVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53808;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ATOMIC_COUNTER_BUFFER_INDEX;
    referencedByTessEvaluationVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53850;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_LOCATION;
    bufferBindingValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53898;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b538e0;
    pCVar5 = (this->super_TestCase).m_context;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53928;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_extension = (char *)0x0;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    referencedByGeometryVerifier._44_8_ = variableFilter_1;
    referencedByComputeVerifier._44_8_ = variableFilter_1;
    nameLengthValidator.super_SingleBlockValidator._44_8_ = variableFilter_1;
    referencedByTessControlVerifier._44_8_ = variableFilter_1;
    referencedByTessEvaluationVerifier._44_8_ = variableFilter_1;
    bufferBindingValidator.super_SingleBlockValidator._44_8_ = variableFilter_1;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    perPatchValidator.super_SingleVariableValidator._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter_1);
    perPatchValidator.super_SingleVariableValidator.m_programID = 0;
    pCVar5 = (this->super_TestCase).m_context;
    local_3f0 = pCVar5->m_renderCtx;
    local_3e8 = pCVar5->m_contextInfo;
    local_3e0 = (char *)0x0;
    local_3d8 = 0x400;
    blockFilter = (VariableSearchFilter)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    local_3d4 = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_3cc = 1;
    pCVar5 = (this->super_TestCase).m_context;
    local_468._M_allocated_capacity = (size_type)pCVar5->m_renderCtx;
    local_468._8_8_ = pCVar5->m_contextInfo;
    local_458 = (char *)0x0;
    local_450 = 0x400;
    section_1.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    local_44c = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_444 = 5;
    pCVar5 = (this->super_TestCase).m_context;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    pCVar5 = (this->super_TestCase).m_context;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_extension =
         "GL_EXT_tessellation_shader";
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator._vptr_PropValidator
         = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    topLevelArraySizeValidator.super_SingleVariableValidator._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter_1);
    topLevelArraySizeValidator.super_SingleVariableValidator.m_programID = 3;
    pCVar5 = (this->super_TestCase).m_context;
    __str._M_string_length = (size_type)pCVar5->m_testCtx;
    __str.field_2._M_allocated_capacity = (size_type)pCVar5->m_renderCtx;
    __str.field_2._8_8_ = pCVar5->m_contextInfo;
    __str._M_dataplus._M_p = (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    builder._232_8_ = &__str;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder._8_8_ = &nameLengthValidator;
    builder._16_4_ = 0x92fe;
    builder._24_8_ = &referencedByFragmentVerifier;
    builder._32_4_ = 0x9301;
    builder._40_8_ = &referencedByTessEvaluationVerifier;
    builder._48_4_ = 0x92fd;
    builder._56_8_ = &referencedByComputeVerifier;
    builder._64_4_ = 0x9300;
    builder._72_8_ = &referencedByGeometryVerifier;
    builder._80_4_ = 0x930e;
    builder._88_8_ = &bufferBindingValidator;
    builder._96_4_ = 0x92ff;
    builder._104_8_ = &referencedByTessControlVerifier;
    builder._112_4_ = 0x92f9;
    builder._120_8_ = &props;
    builder._128_4_ = 0x92fc;
    builder._136_8_ = &validators;
    builder._144_4_ = 0x9306;
    builder._152_8_ = &perPatchValidator;
    builder._160_4_ = 0x930a;
    builder._168_8_ = &blockFilter;
    builder._176_4_ = 0x930b;
    builder._184_8_ = &section_1;
    builder._192_4_ = 0x9309;
    builder._200_8_ = &validators_1;
    builder._208_4_ = 0x9307;
    builder._216_8_ = &topLevelArraySizeValidator;
    builder._224_4_ = 0x9308;
    builder._240_4_ = 0x92fa;
    builder._248_8_ = (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar18 = 0;
      do {
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        variableFilter = (VariableSearchFilter)&local_6a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&variableFilter,"UniformResource","");
        std::operator+(&local_318,"Uniform resource \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar18);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_318);
        pTVar13 = (TestLog *)(plVar10 + 2);
        if ((TestLog *)*plVar10 == pTVar13) {
          local_668._M_allocated_capacity = (size_type)pTVar13->m_log;
          local_668._8_8_ = plVar10[3];
          section_2.m_log = (TestLog *)&local_668;
        }
        else {
          local_668._M_allocated_capacity = (size_type)pTVar13->m_log;
          section_2.m_log = (TestLog *)*plVar10;
        }
        *plVar10 = (long)pTVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_4,pTVar3,(string *)&variableFilter,(string *)&section_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)section_2.m_log != &local_668) {
          operator_delete(section_2.m_log,(ulong)(local_668._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (variableFilter != (VariableSearchFilter)&local_6a8) {
          operator_delete((void *)variableFilter,local_6a8._M_allocated_capacity + 1);
        }
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        variableFilter.m_shaderTypeBits = 0;
        variableFilter.m_storageBits = 0;
        iStack_6b0._M_current = (uint *)0x0;
        local_6a8._M_allocated_capacity = 0;
        local_668._M_allocated_capacity = 0;
        section_2.m_log = (TestLog *)0x0;
        lVar19 = 0x10;
        poVar20 = &builder.m_str;
        do {
          if ((((this->m_queryTarget).propFlags & (*(PropValidator **)poVar20)->m_validationProp) !=
               0) && (bVar6 = anon_unknown_0::PropValidator::isSupported(*(PropValidator **)poVar20)
                     , bVar6)) {
            if (iStack_6b0._M_current == (uint *)local_6a8._M_allocated_capacity) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&variableFilter,
                         iStack_6b0,(uint *)(poVar20 + -8));
            }
            else {
              *iStack_6b0._M_current = *(uint *)&((MessageBuilder *)(poVar20 + -8))->m_log;
              iStack_6b0._M_current = iStack_6b0._M_current + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&section_2,(value_type *)poVar20);
          }
          poVar20 = poVar20 + 0x10;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_02,iVar7),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&section_2);
        if (section_2.m_log != (TestLog *)0x0) {
          operator_delete(section_2.m_log,local_668._M_allocated_capacity - (long)section_2.m_log);
        }
        if (variableFilter != (VariableSearchFilter)0x0) {
          operator_delete((void *)variableFilter,
                          local_6a8._M_allocated_capacity - (long)variableFilter);
        }
        tcu::TestLog::endSection(section_4.m_log);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_UNIFORM_BLOCK:
  case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
    nameLengthValidator.super_SingleBlockValidator._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                   ((PVar15 != PROGRAMINTERFACE_UNIFORM_BLOCK) + STORAGE_UNIFORM);
    pCVar5 = (this->super_TestCase).m_context;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx = pCVar5->m_testCtx
    ;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    nameLengthValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b539a8;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a28;
    blockFilter = (VariableSearchFilter)nameLengthValidator.super_SingleBlockValidator._44_8_;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&blockFilter);
    pCVar5 = (this->super_TestCase).m_context;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a28;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    VVar9 = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                      ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByFragmentVerifier.super_PropValidator._44_4_ = VVar9.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = VVar9.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = SHADERTYPE_FRAGMENT;
    pCVar5 = (this->super_TestCase).m_context;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a28;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    referencedByComputeVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByComputeVerifier.m_shaderType = SHADERTYPE_COMPUTE;
    pCVar5 = (this->super_TestCase).m_context;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = "GL_EXT_geometry_shader";
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a28;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    referencedByGeometryVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByGeometryVerifier.m_shaderType = SHADERTYPE_GEOMETRY;
    pCVar5 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = "GL_EXT_tessellation_shader";
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a28;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    referencedByTessControlVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByTessControlVerifier.m_shaderType = SHADERTYPE_TESSELLATION_CONTROL;
    pCVar5 = (this->super_TestCase).m_context;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension =
         "GL_EXT_tessellation_shader";
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a28;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    referencedByTessEvaluationVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    builder._104_8_ = &referencedByTessEvaluationVerifier;
    referencedByTessEvaluationVerifier.m_shaderType = SHADERTYPE_TESSELLATION_EVALUATION;
    pCVar5 = (this->super_TestCase).m_context;
    builder._120_8_ = &bufferBindingValidator;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BUFFER_BINDING;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator._44_4_ =
         blockFilter.m_shaderTypeBits;
    bufferBindingValidator.super_SingleBlockValidator._48_4_ = blockFilter.m_storageBits;
    bufferBindingValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53a60;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92f9);
    builder._8_8_ = &nameLengthValidator;
    builder._16_4_ = 0x9306;
    builder._32_4_ = 0x930a;
    builder._40_8_ = &referencedByFragmentVerifier;
    builder._48_4_ = 0x930b;
    builder._56_8_ = &referencedByComputeVerifier;
    builder._64_4_ = 0x9309;
    builder._72_8_ = &referencedByGeometryVerifier;
    builder._80_4_ = 0x9307;
    builder._88_8_ = &referencedByTessControlVerifier;
    builder._96_4_ = 0x9308;
    builder._112_4_ = 0x9302;
    builder._24_8_ = (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      ppuVar2 = &props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      lVar18 = 0;
      do {
        pppPVar16 = &validators.
                     super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&props,"BlockResource","");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &perPatchValidator,"Interface block \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar18);
        plVar10 = (long *)std::__cxx11::string::append((char *)&perPatchValidator);
        ppPVar11 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == ppPVar11) {
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar11;
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pppPVar16;
        }
        else {
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar11;
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar10[1];
        *plVar10 = (long)ppPVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_1,pTVar3,(string *)&props,(string *)&validators);
        if (validators.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pppPVar16) {
          operator_delete(validators.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((RenderContext **)
            perPatchValidator.super_SingleVariableValidator.super_PropValidator._vptr_PropValidator
            != &perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_renderContext)
        {
          operator_delete(perPatchValidator.super_SingleVariableValidator.super_PropValidator.
                          _vptr_PropValidator,
                          (ulong)((long)&(perPatchValidator.super_SingleVariableValidator.
                                          super_PropValidator.m_renderContext)->_vptr_RenderContext
                                 + 1));
        }
        if ((pointer *)
            props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar2) {
          operator_delete(props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)props.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar19 = 8;
        poVar20 = &builder.m_str;
        do {
          if ((((this->m_queryTarget).propFlags & (*(PropValidator **)poVar20)->m_validationProp) !=
               0) && (bVar6 = anon_unknown_0::PropValidator::isSupported(*(PropValidator **)poVar20)
                     , bVar6)) {
            if (props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&props,
                         (iterator)
                         props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)(poVar20 + -8));
            }
            else {
              *props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   *(uint *)&((MessageBuilder *)(poVar20 + -8))->m_log;
              props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back(&validators,(value_type *)poVar20);
          }
          poVar20 = poVar20 + 0x10;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var,iVar7),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_dataplus._M_p,program_00,
                   &props,&validators);
        if (validators.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(validators.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)validators.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)props.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)props.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        tcu::TestLog::endSection(section_1.m_log);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_PROGRAM_INPUT:
  case PROGRAMINTERFACE_PROGRAM_OUTPUT:
    bVar6 = PVar15 != PROGRAMINTERFACE_PROGRAM_INPUT;
    if (bVar6) {
      type = ProgramInterfaceDefinition::Program::getLastStage(program_00);
    }
    else {
      type = ProgramInterfaceDefinition::Program::getFirstStage(program_00);
    }
    PVar15 = PVar15 ^ PROGRAMINTERFACE_PROGRAM_INPUT;
    if (type != SHADERTYPE_GEOMETRY || PVar15 != PROGRAMINTERFACE_UNIFORM) {
      if (type == SHADERTYPE_TESSELLATION_CONTROL && PVar15 == PROGRAMINTERFACE_UNIFORM) {
LAB_0055d8f0:
        getMaxPatchVertices(this);
      }
      else if ((type == SHADERTYPE_TESSELLATION_CONTROL) && (bVar6)) {
        ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program_00);
      }
      else if (PVar15 == PROGRAMINTERFACE_UNIFORM && type == SHADERTYPE_TESSELLATION_EVALUATION)
      goto LAB_0055d8f0;
    }
    builder.m_log =
         (TestLog *)ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(type);
    section.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter((uint)bVar6);
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                   (bVar6 + STORAGE_PATCH_IN);
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         ProgramInterfaceDefinition::VariableSearchFilter::logicalOr
                   ((VariableSearchFilter *)&section,
                    (VariableSearchFilter *)&referencedByFragmentVerifier);
    variableFilter =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,(VariableSearchFilter *)&nameLengthValidator);
    pCVar5 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53500;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx = pCVar5->m_testCtx
    ;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_SIZE;
    nameLengthValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53650;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp = PROGRAMRESOURCEPROP_LOCATION
    ;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53898;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b538e0;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    referencedByComputeVerifier._44_8_ = variableFilter;
    nameLengthValidator.super_SingleBlockValidator._44_8_ = variableFilter;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    referencedByGeometryVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByGeometryVerifier.m_shaderType = SHADERTYPE_VERTEX;
    pCVar5 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    referencedByTessControlVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByTessControlVerifier.m_shaderType = SHADERTYPE_FRAGMENT;
    pCVar5 = (this->super_TestCase).m_context;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    referencedByTessEvaluationVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByTessEvaluationVerifier.m_shaderType = SHADERTYPE_COMPUTE;
    pCVar5 = (this->super_TestCase).m_context;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_extension =
         "GL_EXT_geometry_shader";
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    bufferBindingValidator.super_SingleBlockValidator._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    bufferBindingValidator.super_SingleBlockValidator.m_programID = 2;
    pCVar5 = (this->super_TestCase).m_context;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter);
    pCVar5 = (this->super_TestCase).m_context;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter);
    builder._136_8_ = &validators;
    pCVar5 = (this->super_TestCase).m_context;
    builder._168_8_ = &perPatchValidator;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_extension =
         "GL_EXT_tessellation_shader";
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_IS_PER_PATCH;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator._44_4_ =
         variableFilter.m_shaderTypeBits;
    perPatchValidator.super_SingleVariableValidator._48_4_ = variableFilter.m_storageBits;
    perPatchValidator.super_SingleVariableValidator.m_programID = program.m_program.m_program;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53aa0;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder._16_4_ = 0x930e;
    builder._32_4_ = 0x92f9;
    builder._40_8_ = &referencedByComputeVerifier;
    builder._48_4_ = 0x9306;
    builder._56_8_ = &referencedByGeometryVerifier;
    builder._64_4_ = 0x930a;
    builder._72_8_ = &referencedByTessControlVerifier;
    builder._80_4_ = 0x930b;
    builder._88_8_ = &referencedByTessEvaluationVerifier;
    builder._96_4_ = 0x9309;
    builder._104_8_ = &bufferBindingValidator;
    builder._112_4_ = 0x9307;
    builder._120_8_ = &props;
    builder._128_4_ = 0x9308;
    builder._144_4_ = 0x92fa;
    builder._152_8_ = &section;
    builder._160_4_ = 0x92e7;
    builder._8_8_ = (VariableSearchFilter *)&nameLengthValidator;
    builder._24_8_ = &referencedByFragmentVerifier;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      local_6c0 = 0;
      do {
        blockFilter = (VariableSearchFilter)&local_3f0;
        bVar6 = (this->m_queryTarget).interface == PROGRAMINTERFACE_PROGRAM_INPUT;
        pcVar14 = "Output";
        if (bVar6) {
          pcVar14 = "Input";
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&blockFilter,pcVar14,pcVar14 + (6 - (ulong)bVar6));
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        section_1.m_log = (TestLog *)&local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&section_1,"BlockResource","");
        ppRVar1 = &topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.
                   m_renderContext;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,blockFilter,local_3f8 + (long)blockFilter);
        std::__cxx11::string::append((char *)&__str);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str,
                                     (ulong)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[local_6c0].
                                            _M_dataplus._M_p);
        pp_Var12 = (_func_int **)(plVar10 + 2);
        if ((_func_int **)*plVar10 == pp_Var12) {
          topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.
          m_renderContext = (RenderContext *)*pp_Var12;
          topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_contextInfo
               = (ContextInfo *)plVar10[3];
          topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.
          _vptr_PropValidator = (_func_int **)ppRVar1;
        }
        else {
          topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.
          m_renderContext = (RenderContext *)*pp_Var12;
          topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.
          _vptr_PropValidator = (_func_int **)*plVar10;
        }
        topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_testCtx =
             (TestContext *)plVar10[1];
        *plVar10 = (long)pp_Var12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&topLevelArraySizeValidator);
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&validators_1.
                       super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppPVar11 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == ppPVar11) {
          validators_1.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar11;
        }
        else {
          validators_1.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar11;
          validators_1.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar10[1];
        *plVar10 = (long)ppPVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_2,pTVar3,(string *)&section_1,(string *)&validators_1);
        if (validators_1.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&validators_1.
                      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(validators_1.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators_1.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((RenderContext **)
            topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.
            _vptr_PropValidator != ppRVar1) {
          operator_delete(topLevelArraySizeValidator.super_SingleVariableValidator.
                          super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(topLevelArraySizeValidator.super_SingleVariableValidator.
                                          super_PropValidator.m_renderContext)->_vptr_RenderContext
                                 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)section_1.m_log != &local_468) {
          operator_delete(section_1.m_log,(ulong)(local_468._M_allocated_capacity + 1));
        }
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        section_1.m_log = (TestLog *)0x0;
        iStack_470._M_current = (uint *)0x0;
        local_468._M_allocated_capacity = 0;
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar18 = 0xb;
        poVar20 = &builder.m_str;
        do {
          if ((((this->m_queryTarget).propFlags & (*(PropValidator **)poVar20)->m_validationProp) !=
               0) && (bVar6 = anon_unknown_0::PropValidator::isSupported(*(PropValidator **)poVar20)
                     , bVar6)) {
            if (iStack_470._M_current == (uint *)local_468._M_allocated_capacity) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&section_1,iStack_470,
                         (uint *)(poVar20 + -8));
            }
            else {
              *iStack_470._M_current = *(uint *)&((MessageBuilder *)(poVar20 + -8))->m_log;
              iStack_470._M_current = iStack_470._M_current + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back(&validators_1,(value_type *)poVar20);
          }
          poVar20 = poVar20 + 0x10;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_03,iVar7),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_6c0]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&section_1,&validators_1);
        if (validators_1.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(validators_1.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators_1.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)validators_1.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (section_1.m_log != (TestLog *)0x0) {
          operator_delete(section_1.m_log,local_468._M_allocated_capacity - (long)section_1.m_log);
        }
        tcu::TestLog::endSection(section_2.m_log);
        if (blockFilter != (VariableSearchFilter)&local_3f0) {
          operator_delete((void *)blockFilter,(ulong)((long)&local_3f0->_vptr_RenderContext + 1));
        }
        local_6c0 = local_6c0 + 1;
      } while (local_6c0 <
               (int)((ulong)((long)targetResources.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)targetResources.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
    pCVar5 = (this->super_TestCase).m_context;
    builder._8_8_ = pCVar5->m_testCtx;
    builder._16_8_ = pCVar5->m_renderCtx;
    builder._24_8_ = pCVar5->m_contextInfo;
    builder._32_8_ = 0;
    builder._40_4_ = 0x800;
    builder.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53bd0;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx = pCVar5->m_testCtx
    ;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_SIZE;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53c30;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53c78;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         CONCAT44(referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator._4_4_,0x92fb)
    ;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = (TestContext *)&nameLengthValidator
    ;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext =
         (RenderContext *)
         CONCAT44(referencedByFragmentVerifier.super_PropValidator.m_renderContext._4_4_,0x92f9);
    referencedByFragmentVerifier.super_PropValidator.m_extension =
         (char *)CONCAT44(referencedByFragmentVerifier.super_PropValidator.m_extension._4_4_,0x92fa)
    ;
    referencedByFragmentVerifier.super_PropValidator._40_8_ = &builder;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      ppRVar1 = &referencedByComputeVerifier.super_PropValidator.m_renderContext;
      lVar18 = 0;
      do {
        ppRVar17 = &referencedByGeometryVerifier.super_PropValidator.m_renderContext;
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        referencedByComputeVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)ppRVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&referencedByComputeVerifier,"XFBVariableResource","");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &referencedByTessControlVerifier,"Transform feedback varying \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar18);
        plVar10 = (long *)std::__cxx11::string::append((char *)&referencedByTessControlVerifier);
        pp_Var12 = (_func_int **)(plVar10 + 2);
        if ((_func_int **)*plVar10 == pp_Var12) {
          referencedByGeometryVerifier.super_PropValidator.m_renderContext =
               (RenderContext *)*pp_Var12;
          referencedByGeometryVerifier.super_PropValidator.m_contextInfo = (ContextInfo *)plVar10[3]
          ;
          referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
               (_func_int **)ppRVar17;
        }
        else {
          referencedByGeometryVerifier.super_PropValidator.m_renderContext =
               (RenderContext *)*pp_Var12;
          referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
               (_func_int **)*plVar10;
        }
        referencedByGeometryVerifier.super_PropValidator.m_testCtx = (TestContext *)plVar10[1];
        *plVar10 = (long)pp_Var12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&referencedByTessEvaluationVerifier,pTVar3,
                   (string *)&referencedByComputeVerifier,(string *)&referencedByGeometryVerifier);
        if ((RenderContext **)referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator
            != ppRVar17) {
          operator_delete(referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByGeometryVerifier.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        if ((RenderContext **)
            referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator !=
            &referencedByTessControlVerifier.super_PropValidator.m_renderContext) {
          operator_delete(referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByTessControlVerifier.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        if ((RenderContext **)referencedByComputeVerifier.super_PropValidator._vptr_PropValidator !=
            ppRVar1) {
          operator_delete(referencedByComputeVerifier.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByComputeVerifier.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        referencedByComputeVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)0x0;
        referencedByComputeVerifier.super_PropValidator.m_testCtx = (TestContext *)0x0;
        referencedByComputeVerifier.super_PropValidator.m_renderContext = (RenderContext *)0x0;
        referencedByGeometryVerifier.super_PropValidator.m_renderContext = (RenderContext *)0x0;
        referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)0x0;
        referencedByGeometryVerifier.super_PropValidator.m_testCtx = (TestContext *)0x0;
        lVar19 = 3;
        __x = (ContextInfo **)&referencedByFragmentVerifier.super_PropValidator.m_testCtx;
        do {
          if (((this->m_queryTarget).propFlags &
              *(ProgramResourcePropFlags *)&(*__x)->m_compressedTextureFormats) != 0) {
            bVar6 = anon_unknown_0::PropValidator::isSupported((PropValidator *)*__x);
            if (bVar6) {
              if (referencedByComputeVerifier.super_PropValidator.m_testCtx ==
                  (TestContext *)referencedByComputeVerifier.super_PropValidator.m_renderContext) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                           &referencedByComputeVerifier,
                           (iterator)referencedByComputeVerifier.super_PropValidator.m_testCtx,
                           (uint *)(__x + -1));
              }
              else {
                *(uint *)&(referencedByComputeVerifier.super_PropValidator.m_testCtx)->m_platform =
                     *(uint *)&((PropValidator *)(__x + -1))->_vptr_PropValidator;
                referencedByComputeVerifier.super_PropValidator.m_testCtx =
                     (TestContext *)
                     ((long)&(referencedByComputeVerifier.super_PropValidator.m_testCtx)->m_platform
                     + 4);
              }
              std::
              vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
              ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                           *)&referencedByGeometryVerifier,(value_type *)__x);
            }
          }
          __x = __x + 2;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_00,iVar7),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &referencedByComputeVerifier,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&referencedByGeometryVerifier);
        if (referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator !=
            (_func_int **)0x0) {
          operator_delete(referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator,
                          (long)referencedByGeometryVerifier.super_PropValidator.m_renderContext -
                          (long)referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator
                         );
        }
        if (referencedByComputeVerifier.super_PropValidator._vptr_PropValidator != (_func_int **)0x0
           ) {
          operator_delete(referencedByComputeVerifier.super_PropValidator._vptr_PropValidator,
                          (long)referencedByComputeVerifier.super_PropValidator.m_renderContext -
                          (long)referencedByComputeVerifier.super_PropValidator._vptr_PropValidator)
          ;
        }
        tcu::TestLog::endSection
                  ((TestLog *)
                   referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_BUFFER_VARIABLE:
    variableFilter_1 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_BUFFER);
    pCVar5 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53500;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx = pCVar5->m_testCtx
    ;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_SIZE;
    nameLengthValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    nameLengthValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53650;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_STRIDE;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter_1.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53730;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BLOCK_INDEX;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53778;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR;
    referencedByGeometryVerifier.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b537c0;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_STRIDE;
    referencedByTessControlVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53808;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar5->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar5->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar5->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_OFFSET;
    referencedByTessEvaluationVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53928;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_extension = (char *)0x0;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    bufferBindingValidator.super_SingleBlockValidator.m_programID = program.m_program.m_program;
    bufferBindingValidator.super_SingleBlockValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b538e0;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    referencedByGeometryVerifier._44_8_ = variableFilter_1;
    referencedByComputeVerifier._44_8_ = variableFilter_1;
    nameLengthValidator.super_SingleBlockValidator._44_8_ = variableFilter_1;
    referencedByTessControlVerifier._44_8_ = variableFilter_1;
    referencedByTessEvaluationVerifier._44_8_ = variableFilter_1;
    bufferBindingValidator.super_SingleBlockValidator._44_8_ = variableFilter_1;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    pCVar5 = (this->super_TestCase).m_context;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    pCVar5 = (this->super_TestCase).m_context;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_extension = (char *)0x0;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    perPatchValidator.super_SingleVariableValidator.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    perPatchValidator.super_SingleVariableValidator._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter_1);
    perPatchValidator.super_SingleVariableValidator.m_programID = 5;
    pCVar5 = (this->super_TestCase).m_context;
    local_3f0 = pCVar5->m_renderCtx;
    local_3e8 = pCVar5->m_contextInfo;
    local_3e0 = "GL_EXT_geometry_shader";
    local_3d8 = 0x400;
    blockFilter = (VariableSearchFilter)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    local_3d4 = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_3cc = 2;
    pCVar5 = (this->super_TestCase).m_context;
    local_468._M_allocated_capacity = (size_type)pCVar5->m_renderCtx;
    local_468._8_8_ = pCVar5->m_contextInfo;
    local_458 = "GL_EXT_tessellation_shader";
    local_450 = 0x400;
    section_1.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    local_44c = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_444 = 3;
    pCVar5 = (this->super_TestCase).m_context;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar5->m_testCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar5->m_renderCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53970;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    builder._200_8_ = &validators_1;
    pCVar5 = (this->super_TestCase).m_context;
    builder._216_8_ = &topLevelArraySizeValidator;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_testCtx =
         pCVar5->m_testCtx;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_renderContext =
         pCVar5->m_renderCtx;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_contextInfo =
         pCVar5->m_contextInfo;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_extension =
         (char *)0x0;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator._44_4_ =
         variableFilter_1.m_shaderTypeBits;
    topLevelArraySizeValidator.super_SingleVariableValidator._48_4_ = variableFilter_1.m_storageBits
    ;
    topLevelArraySizeValidator.super_SingleVariableValidator.m_programID =
         program.m_program.m_program;
    topLevelArraySizeValidator.super_SingleVariableValidator.super_PropValidator._vptr_PropValidator
         = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53b40;
    builder._232_8_ = &__str;
    __str._M_string_length = (size_type)pCVar5->m_testCtx;
    __str.field_2._M_allocated_capacity = (size_type)pCVar5->m_renderCtx;
    __str.field_2._8_8_ = pCVar5->m_contextInfo;
    __str._M_dataplus._M_p = (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__00b53b88;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder._8_8_ = &nameLengthValidator;
    builder._16_4_ = 0x92fe;
    builder._24_8_ = &referencedByFragmentVerifier;
    builder._32_4_ = 0x92fd;
    builder._40_8_ = &referencedByComputeVerifier;
    builder._48_4_ = 0x9300;
    builder._56_8_ = &referencedByGeometryVerifier;
    builder._64_4_ = 0x92ff;
    builder._72_8_ = &referencedByTessControlVerifier;
    builder._80_4_ = 0x92f9;
    builder._88_8_ = &bufferBindingValidator;
    builder._96_4_ = 0x92fc;
    builder._104_8_ = &referencedByTessEvaluationVerifier;
    builder._112_4_ = 0x9306;
    builder._120_8_ = &props;
    builder._128_4_ = 0x930a;
    builder._136_8_ = &validators;
    builder._144_4_ = 0x930b;
    builder._152_8_ = &perPatchValidator;
    builder._160_4_ = 0x9309;
    builder._168_8_ = &blockFilter;
    builder._176_4_ = 0x9307;
    builder._184_8_ = &section_1;
    builder._192_4_ = 0x9308;
    builder._208_4_ = 0x930c;
    builder._224_4_ = 0x930d;
    builder._240_4_ = 0x92fa;
    builder._248_8_ = (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar18 = 0;
      do {
        pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        variableFilter = (VariableSearchFilter)&local_6a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&variableFilter,"BufferVariableResource","");
        std::operator+(&local_318,"Buffer variable \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar18);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_318);
        pTVar13 = (TestLog *)(plVar10 + 2);
        if ((TestLog *)*plVar10 == pTVar13) {
          local_668._M_allocated_capacity = (size_type)pTVar13->m_log;
          local_668._8_8_ = plVar10[3];
          section_2.m_log = (TestLog *)&local_668;
        }
        else {
          local_668._M_allocated_capacity = (size_type)pTVar13->m_log;
          section_2.m_log = (TestLog *)*plVar10;
        }
        *plVar10 = (long)pTVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_4,pTVar3,(string *)&variableFilter,(string *)&section_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)section_2.m_log != &local_668) {
          operator_delete(section_2.m_log,(ulong)(local_668._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (variableFilter != (VariableSearchFilter)&local_6a8) {
          operator_delete((void *)variableFilter,local_6a8._M_allocated_capacity + 1);
        }
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        variableFilter.m_shaderTypeBits = 0;
        variableFilter.m_storageBits = 0;
        iStack_6b0._M_current = (uint *)0x0;
        local_6a8._M_allocated_capacity = 0;
        local_668._M_allocated_capacity = 0;
        section_2.m_log = (TestLog *)0x0;
        lVar19 = 0x10;
        poVar20 = &builder.m_str;
        do {
          if ((((this->m_queryTarget).propFlags & (*(PropValidator **)poVar20)->m_validationProp) !=
               0) && (bVar6 = anon_unknown_0::PropValidator::isSupported(*(PropValidator **)poVar20)
                     , bVar6)) {
            if (iStack_6b0._M_current == (uint *)local_6a8._M_allocated_capacity) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&variableFilter,
                         iStack_6b0,(uint *)(poVar20 + -8));
            }
            else {
              *iStack_6b0._M_current = *(uint *)&((MessageBuilder *)(poVar20 + -8))->m_log;
              iStack_6b0._M_current = iStack_6b0._M_current + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&section_2,(value_type *)poVar20);
          }
          poVar20 = poVar20 + 0x10;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_01,iVar7),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&section_2);
        if (section_2.m_log != (TestLog *)0x0) {
          operator_delete(section_2.m_log,local_668._M_allocated_capacity - (long)section_2.m_log);
        }
        if (variableFilter != (VariableSearchFilter)0x0) {
          operator_delete((void *)variableFilter,
                          local_6a8._M_allocated_capacity - (long)variableFilter);
        }
        tcu::TestLog::endSection(section_4.m_log);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&targetResources);
  return STOP;
}

Assistant:

ProgramInterfaceQueryTestCase::IterateResult ProgramInterfaceQueryTestCase::iterate (void)
{
	struct TestProperty
	{
		glw::GLenum				prop;
		const PropValidator*	validator;
	};

	const ProgramInterfaceDefinition::Program*	programDefinition	= getAndCheckProgramDefinition();
	const std::vector<std::string>				targetResources		= getQueryTargetResources();
	glu::ShaderProgram							program				(m_context.getRenderContext(), generateProgramInterfaceProgramSources(programDefinition));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		// Feedback varyings
		if (!programDefinition->getTransformFeedbackVaryings().empty())
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());
			builder << "Transform feedback varyings: {";
			for (int ndx = 0; ndx < (int)programDefinition->getTransformFeedbackVaryings().size(); ++ndx)
			{
				if (ndx)
					builder << ", ";
				builder << "\"" << programDefinition->getTransformFeedbackVaryings()[ndx] << "\"";
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
			checkProgramResourceUsage(programDefinition, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

			// within limits
			throw tcu::TestError("could not build program");
		}
	}

	// Check interface props

	switch (m_queryTarget.interface)
	{
		case PROGRAMINTERFACE_UNIFORM:
		{
			const VariableSearchFilter					uniformFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_UNIFORM);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						uniformFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						-1,					uniformFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						uniformFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						uniformFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const AtomicCounterBufferIndexVerifier		atomicCounterBufferIndexVerifier	(m_context, program.getProgram(),						uniformFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						uniformFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						uniformFilter);
			const OffsetValidator						offsetVerifier						(m_context, program.getProgram(),						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	uniformFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_ATOMIC_COUNTER_BUFFER_INDEX,			&atomicCounterBufferIndexVerifier	},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetVerifier						},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "UniformResource", "Uniform resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_UNIFORM_BLOCK:
		case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
		{
			const glu::Storage						storage								= (m_queryTarget.interface == PROGRAMINTERFACE_UNIFORM_BLOCK) ? (glu::STORAGE_UNIFORM) : (glu::STORAGE_BUFFER);
			const VariableSearchFilter				blockFilter							= VariableSearchFilter::createStorageFilter(storage);

			const BlockNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						blockFilter);
			const BlockReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						blockFilter);
			const BlockReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	blockFilter);
			const BufferBindingValidator			bufferBindingValidator				(m_context, program.getProgram(),						blockFilter);

			const TestProperty allProperties[] =
			{
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_BUFFER_BINDING,						&bufferBindingValidator				},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BlockResource", "Interface block \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_PROGRAM_INPUT:
		case PROGRAMINTERFACE_PROGRAM_OUTPUT:
		{
			const bool									isInputCase							= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT);
			const glu::Storage							varyingStorage						= (isInputCase) ? (glu::STORAGE_IN) : (glu::STORAGE_OUT);
			const glu::Storage							patchStorage						= (isInputCase) ? (glu::STORAGE_PATCH_IN) : (glu::STORAGE_PATCH_OUT);
			const glu::ShaderType						shaderType							= (isInputCase) ? (programDefinition->getFirstStage()) : (programDefinition->getLastStage());
			const int									unsizedArraySize					= (isInputCase && shaderType == glu::SHADERTYPE_GEOMETRY)					? (1)															// input points
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (getMaxPatchVertices())										// input batch size
																							: (!isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (programDefinition->getTessellationNumOutputPatchVertices())	// output batch size
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? (getMaxPatchVertices())										// input batch size
																							: (-1);
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::logicalAnd(VariableSearchFilter::createShaderTypeFilter(shaderType),
																															   VariableSearchFilter::logicalOr(VariableSearchFilter::createStorageFilter(varyingStorage),
																																							   VariableSearchFilter::createStorageFilter(patchStorage)));

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						unsizedArraySize,		variableFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const PerPatchValidator						perPatchValidator					(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
				{ GL_IS_PER_PATCH,							&perPatchValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const std::string					resourceInterfaceName	= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT) ? ("Input") : ("Output");
				const tcu::ScopedLogSection			section					(m_testCtx.getLog(), "BlockResource", resourceInterfaceName + " resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl						= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_BUFFER_VARIABLE:
		{
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_BUFFER);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						0,					variableFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						variableFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						variableFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const OffsetValidator						offsetValidator						(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const TopLevelArraySizeValidator			topLevelArraySizeValidator			(m_context, program.getProgram(),						variableFilter);
			const TopLevelArrayStrideValidator			topLevelArrayStrideValidator		(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetValidator					},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TOP_LEVEL_ARRAY_SIZE,					&topLevelArraySizeValidator			},
				{ GL_TOP_LEVEL_ARRAY_STRIDE,				&topLevelArrayStrideValidator		},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BufferVariableResource", "Buffer variable \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
		{
			const TransformFeedbackTypeValidator		typeValidator			(m_context);
			const TransformFeedbackArraySizeValidator	arraySizeValidator		(m_context);
			const TransformFeedbackNameLengthValidator	nameLengthValidator		(m_context);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,					&arraySizeValidator				},
				{ GL_NAME_LENGTH,					&nameLengthValidator			},
				{ GL_TYPE,							&typeValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "XFBVariableResource", "Transform feedback varying \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		default:
			DE_ASSERT(false);
	}

	return STOP;
}